

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

void __thiscall ON_SubDMeshFragment::Dump(ON_SubDMeshFragment *this,ON_TextLog *text_log)

{
  uint uVar1;
  uint uVar2;
  double *pdVar3;
  size_t sVar4;
  ON_SurfaceCurvature *a;
  ON_Color *a_00;
  char local_69;
  undefined1 local_60 [8];
  ON_TextLogIndent ident2;
  int local_48;
  ON_SubDComponentLocation cl;
  int pass;
  undefined1 local_38 [8];
  ON_TextLogIndent indent1;
  uint grid_point_count;
  uint n;
  uint count;
  ON_TextLog *text_log_local;
  ON_SubDMeshFragment *this_local;
  
  uVar1 = VertexCount(this);
  ON_TextLog::Print(text_log,"ON_SubDMeshFragment: vertex count = %u",(ulong)uVar1);
  uVar2 = ON_SubDMeshFragmentGrid::SideSegmentCount(&this->m_grid);
  indent1._12_4_ = ON_SubDMeshFragmentGrid::GridPointCount(&this->m_grid);
  if (uVar1 == 0) {
    ON_TextLog::PrintNewLine(text_log);
  }
  else if ((uVar2 == 0) || (uVar1 != indent1._12_4_)) {
    ON_TextLog::Print(text_log,L". Invalid fragment.\n");
  }
  else {
    ON_TextLog::Print(text_log,L", %u x %u grid\n",(ulong)uVar2);
    ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)local_38,text_log);
    ON_TextLog::Print(text_log,L"bounding box (%g to %g X %g to %g X %g to %g)\n",
                      (this->m_surface_bbox).m_min.x,(this->m_surface_bbox).m_max.x,
                      (this->m_surface_bbox).m_min.y,(this->m_surface_bbox).m_max.y,
                      (this->m_surface_bbox).m_min.z,(this->m_surface_bbox).m_max.z);
    ON_TextLog::Print(text_log,L"pack rect (%g,%g),(%g,%g),(%g,%g),(%g,%g) \n",
                      this->m_pack_rect[0][0],this->m_pack_rect[0][1],this->m_pack_rect[1][0],
                      this->m_pack_rect[1][1],this->m_pack_rect[2][0],this->m_pack_rect[2][1],
                      this->m_pack_rect[3][0],this->m_pack_rect[3][1]);
    for (local_48 = 0; local_48 < 2; local_48 = local_48 + 1) {
      local_69 = '\x01';
      if (local_48 != 0) {
        local_69 = '\x02';
      }
      ident2._15_1_ = local_69;
      if (local_69 == '\x01') {
        ON_TextLog::Print(text_log,"Corners:\n");
      }
      else if (local_69 == '\x02') {
        ON_TextLog::Print(text_log,"Surface:\n");
      }
      ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)local_60,text_log);
      pdVar3 = PointArray(this,ident2._15_1_);
      uVar1 = PointArrayCount(this,ident2._15_1_);
      sVar4 = PointArrayStride(this,ident2._15_1_);
      Internal_DumpFragmentArray(text_log,L"points",3,pdVar3,uVar1,sVar4);
      pdVar3 = NormalArray(this,ident2._15_1_);
      uVar1 = NormalArrayCount(this,ident2._15_1_);
      sVar4 = NormalArrayStride(this,ident2._15_1_);
      Internal_DumpFragmentArray(text_log,L"normals",3,pdVar3,uVar1,sVar4);
      pdVar3 = TextureCoordinateArray(this,ident2._15_1_);
      uVar1 = TextureCoordinateArrayCount(this,ident2._15_1_);
      sVar4 = TextureCoordinateArrayStride(this,ident2._15_1_);
      Internal_DumpFragmentArray(text_log,L"texture coordinates",3,pdVar3,uVar1,sVar4);
      a = CurvatureArray(this,ident2._15_1_);
      uVar1 = CurvatureArrayCount(this,ident2._15_1_);
      Internal_DumpFragmentArray(text_log,L"curvatures",2,&a->k1,uVar1,2);
      a_00 = ColorArray(this,ident2._15_1_);
      uVar1 = ColorArrayCount(this,ident2._15_1_);
      sVar4 = ColorArrayStride(this,ident2._15_1_);
      Internal_DumpFragmentColorArray(text_log,L"colors",a_00,uVar1,sVar4);
      ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)local_60);
    }
    ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)local_38);
  }
  return;
}

Assistant:

void ON_SubDMeshFragment::Dump(ON_TextLog& text_log) const
{
  const unsigned count = VertexCount();
  text_log.Print("ON_SubDMeshFragment: vertex count = %u", count);
  const unsigned n = m_grid.SideSegmentCount();
  const unsigned grid_point_count = m_grid.GridPointCount();
  if (count > 0)
  {
    if (n > 0 && count == grid_point_count)
    {
      text_log.Print(
        L", %u x %u grid\n",
        n, n
      );

      ON_TextLogIndent indent1(text_log);
      text_log.Print(
        L"bounding box (%g to %g X %g to %g X %g to %g)\n",
        m_surface_bbox.m_min.x, m_surface_bbox.m_max.x,
        m_surface_bbox.m_min.y, m_surface_bbox.m_max.y,
        m_surface_bbox.m_min.z, m_surface_bbox.m_max.z
      );

      text_log.Print(
        L"pack rect (%g,%g),(%g,%g),(%g,%g),(%g,%g) \n",
        m_pack_rect[0][0], m_pack_rect[0][1],
        m_pack_rect[1][0], m_pack_rect[1][1],
        m_pack_rect[2][0], m_pack_rect[2][1],
        m_pack_rect[3][0], m_pack_rect[3][1]
      );

      for (int pass = 0; pass < 2; ++pass)
      {
        const ON_SubDComponentLocation cl = (0 == pass) ? ON_SubDComponentLocation::ControlNet : ON_SubDComponentLocation::Surface;
        if (ON_SubDComponentLocation::ControlNet == cl)
          text_log.Print("Corners:\n");
        else if (ON_SubDComponentLocation::Surface == cl)
          text_log.Print("Surface:\n");
        ON_TextLogIndent ident2(text_log);
        Internal_DumpFragmentArray(
          text_log, L"points", 3,
          PointArray(cl),
          PointArrayCount(cl),
          PointArrayStride(cl));
        Internal_DumpFragmentArray(
          text_log, L"normals", 3,
          NormalArray(cl),
          NormalArrayCount(cl),
          NormalArrayStride(cl));
        Internal_DumpFragmentArray(
          text_log, L"texture coordinates", 3, // tcs are uvw
          TextureCoordinateArray(cl),
          TextureCoordinateArrayCount(cl),
          TextureCoordinateArrayStride(cl));
        Internal_DumpFragmentArray(
          text_log, L"curvatures", 2, // 2 principal
          (const double*)(CurvatureArray(cl)),
          CurvatureArrayCount(cl),
          sizeof(ON_SurfaceCurvature)/sizeof(double));
        Internal_DumpFragmentColorArray(
          text_log, L"colors",
          ColorArray(cl),
          ColorArrayCount(cl),
          ColorArrayStride(cl)
        );
      }
    }
    else
    {
      text_log.Print(L". Invalid fragment.\n");
    }
  }
  else
  {
    text_log.PrintNewLine();
  }
}